

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTPNIsInBase::fold_binop(CTPNIsInBase *this)

{
  CTPNArglistBase *this_00;
  int iVar1;
  CTPNArg *pCVar2;
  CTcConstVal *this_01;
  CTcPrsNode *in_RDI;
  CTPNArg *nxt;
  CTPNArg *prv;
  CTPNArg *arg;
  CTPNArglist *lst;
  CTcConstVal *in_stack_000000b0;
  CTcConstVal *in_stack_000000b8;
  CTPNArgBase *local_30;
  CTPNArgBase *local_20;
  CTcPrsNode *local_8;
  
  iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x25324c);
  local_8 = in_RDI;
  if (iVar1 != 0) {
    this_00 = (CTPNArglistBase *)in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
    local_20 = &CTPNArglistBase::get_arg_list_head(this_00)->super_CTPNArgBase;
    while (local_20 != (CTPNArgBase *)0x0) {
      local_30 = &CTPNArgBase::get_next_arg(local_20)->super_CTPNArgBase;
      iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x2532ab);
      if (iVar1 != 0) {
        (**(code **)(*in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + 8))();
        (*(local_20->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[1])();
        iVar1 = CTcConstVal::is_equal_to(in_stack_000000b8,in_stack_000000b0);
        if (iVar1 != 0) {
          *(byte *)&in_RDI[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
               *(byte *)&in_RDI[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase & 0xfe | 1;
          local_30 = (CTPNArgBase *)0x0;
        }
        iVar1 = CTPNArglistBase::get_argc(this_00);
        CTPNArglistBase::set_argc(this_00,iVar1 + -1);
        CTPNArglistBase::set_arg_list_head(this_00,(CTPNArg *)local_30);
      }
      local_20 = local_30;
    }
    pCVar2 = CTPNArglistBase::get_arg_list_head(this_00);
    if (pCVar2 == (CTPNArg *)0x0) {
      this_01 = (CTcConstVal *)
                (**(code **)(*in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase + 8))();
      CTcConstVal::set_bool
                (this_01,(uint)(*(byte *)&in_RDI[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase & 1));
      local_8 = (CTcPrsNode *)in_RDI[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
    }
  }
  return local_8;
}

Assistant:

CTcPrsNode *CTPNIsInBase::fold_binop()
{
    CTPNArglist *lst;
    CTPNArg *arg;
    CTPNArg *prv;
    CTPNArg *nxt;
    
    /* if the left-hand side isn't constant, there's nothing to do */
    if (!left_->is_const())
        return this;

    /* the right side is always an argument list */
    lst = (CTPNArglist *)right_;

    /* look for the value in the arguments */
    for (prv = 0, arg = lst->get_arg_list_head() ; arg != 0 ; arg = nxt)
    {
        /* remember the next argument, in case we eliminate this one */
        nxt = arg->get_next_arg();
        
        /* check to see if this argument is a constant */
        if (arg->is_const())
        {
            /*
             *   This one's a constant, so check to see if we found the
             *   left side value.  If the left side equals this value,
             *   note that we found the value.
             */
            if (left_->get_const_val()->is_equal_to(arg->get_const_val()))
            {
                /*
                 *   The values are equal, so the result of the expression
                 *   is definitely 'true'.  
                 */
                const_true_ = TRUE;

                /*
                 *   Because the 'is in' operator only evaluates operands
                 *   from the 'in' list until it finds one that matches,
                 *   any remaining operands will simply never be
                 *   evaluated.  We can thus discard the rest of the
                 *   argument list.  
                 */
                nxt = 0;
            }

            /*
             *   We now know whether the left side equals this constant
             *   list element.  This is never going to change because both
             *   values are constant, so there's no point in making this
             *   same comparison over and over again at run-time.  We can
             *   thus eliminate this argument from the list.  
             */
            lst->set_argc(lst->get_argc() - 1);
            if (prv == 0)
                lst->set_arg_list_head(nxt);
            else
                prv->set_next_arg(nxt);
        }
    }

    /*
     *   If the argument list is now completely empty, the result of the
     *   expression is a constant.  
     */
    if (lst->get_arg_list_head() == 0)
    {
        /* set the left operand's value to our result */
        left_->get_const_val()->set_bool(const_true_);
        
        /* return the constant value in place of the entire expression */
        return left_;
    }

    /* we're not a constant, to return myself unchanged */
    return this;
}